

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O1

void __thiscall
IO::writeNicking(IO *this,
                vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                *nicking_arr,string *filename)

{
  pointer paVar1;
  char cVar2;
  ostream *poVar3;
  array<float,_4UL> *__range2;
  long lVar4;
  pointer paVar5;
  array<float,_4UL> timestep;
  ofstream outstream;
  undefined8 local_238;
  undefined8 uStack_230;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  std::ofstream::ofstream((string *)&local_228);
  std::ofstream::open((string *)&local_228,(_Ios_Openmode)filename);
  paVar1 = (nicking_arr->
           super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (paVar5 = (nicking_arr->
                super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                )._M_impl.super__Vector_impl_data._M_start; paVar5 != paVar1; paVar5 = paVar5 + 1) {
    local_238 = *(undefined8 *)paVar5->_M_elems;
    uStack_230 = *(undefined8 *)(paVar5->_M_elems + 2);
    lVar4 = 0;
    do {
      poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)&local_238 + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10);
    cVar2 = (char)(string *)&local_228;
    std::ios::widen((char)*(undefined8 *)(local_228 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
  }
  std::ofstream::close();
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void IO::writeNicking(std::vector<std::array<float, 4>> nicking_arr, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (auto timestep: nicking_arr){
		for (auto nicked:  timestep){
			outstream << nicked << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}